

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O1

bool Grammar::is_dictionary_type(string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  string types_of_dictionary;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Dictionary<","");
  bVar3 = str_utils::starts_with(str,&local_e8);
  bVar4 = true;
  if (bVar3) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,">","");
    bVar4 = str_utils::ends_with(str,&local_c8);
    bVar4 = !bVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (bVar4) {
    bVar4 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_e8,(ulong)str);
    bVar4 = 0 < (int)(uint)local_e8._M_string_length;
    if (0 < (int)(uint)local_e8._M_string_length) {
      if (*local_e8._M_dataplus._M_p != ',') {
        uVar5 = (ulong)((uint)local_e8._M_string_length & 0x7fffffff);
        uVar2 = 1;
        do {
          uVar6 = uVar2;
          if (uVar5 == uVar6) {
            bVar4 = uVar6 < uVar5;
            goto LAB_001412c8;
          }
          uVar2 = uVar6 + 1;
        } while (local_e8._M_dataplus._M_p[uVar6] != ',');
        bVar4 = uVar6 < uVar5;
      }
      std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_e8);
      str_utils::trim(&local_68,&local_88);
      bVar3 = is_object_type(&local_68);
      if (bVar3) {
        std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_e8);
        str_utils::trim(&local_48,&local_a8);
        bVar3 = is_object_type(&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
LAB_001412c8:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    bVar4 = (bool)(bVar4 & bVar3);
  }
  return bVar4;
}

Assistant:

bool Grammar::is_dictionary_type(const std::string& str) {
    if (!str_utils::starts_with(str, "Dictionary<") || !str_utils::ends_with(str, ">"))
        return false;
    std::string types_of_dictionary = str.substr(11, int(str.size()) - 12);
    for (int i = 0; i < int(types_of_dictionary.size()); i++)
        if (types_of_dictionary[i] == ',')
            return is_object_type(str_utils::trim(types_of_dictionary.substr(0, i))) &&
                   is_object_type(str_utils::trim(types_of_dictionary.substr(i + 1)));
    return false;
}